

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

PLTermBuilder __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,int num_breakpoints)

{
  SafeInt<int> extra_bytes;
  PLTermBuilder PVar1;
  
  extra_bytes = operator*((SafeInt<int>)0x10,num_breakpoints);
  PVar1.impl_ = Allocate<mp::PLTerm>(this,PLTERM,extra_bytes.value_);
  (PVar1.impl_)->num_breakpoints = num_breakpoints;
  PVar1.slope_index_ = 0;
  PVar1.breakpoint_index_ = 0;
  return PVar1;
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    MP_ASSERT(num_breakpoints > 0, "invalid number of breakpoints");
    SafeInt<int> size = sizeof(double) * 2;
    PLTerm::Impl *impl = Allocate<PLTerm>(
          expr::PLTERM, val(size * num_breakpoints));
    impl->num_breakpoints = num_breakpoints;
    return PLTermBuilder(impl);
  }